

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall QTextEditMimeData::hasFormat(QTextEditMimeData *this,QString *format)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  QString *in_RSI;
  QOffsetStringArray<std::array<char,_76UL>,_std::array<unsigned_char,_5UL>_> *in_RDI;
  long in_FS_OFFSET;
  int i;
  int size;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  QString *lhs;
  undefined4 local_38;
  undefined1 local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = QTextDocumentFragment::isEmpty();
  if ((uVar4 & 1) == 0) {
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      lhs = in_RSI;
      QOffsetStringArray<std::array<char,_76UL>,_std::array<unsigned_char,_5UL>_>::at
                (in_RDI,(int)((ulong)in_RSI >> 0x20));
      QLatin1String::QLatin1String((QLatin1String *)in_RDI,(char *)lhs);
      bVar2 = ::operator==(lhs,(QLatin1StringView *)
                               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      if (bVar2) {
        local_19 = true;
        goto LAB_0072171c;
      }
    }
    local_19 = false;
  }
  else {
    bVar3 = QMimeData::hasFormat((QString *)in_RDI);
    local_19 = (bool)(bVar3 & 1);
  }
LAB_0072171c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QTextEditMimeData::hasFormat(const QString &format) const
{
    if (!fragment.isEmpty()) {
        constexpr auto size = supportedMimeTypes.count();
        for (int i = 0; i < size; ++i) {
            if (format == QLatin1StringView(supportedMimeTypes.at(i)))
                return true;
        }
        return false;
    }

    return QMimeData::hasFormat(format);
}